

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O2

void __thiscall
presolve::HighsPostsolveStack::fixedColAtZero<HighsTripletListSlice>
          (HighsPostsolveStack *this,HighsInt col,double colCost,
          HighsMatrixSlice<HighsTripletListSlice> *colVec)

{
  pointer pNVar1;
  HighsInt *pHVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  FixedCol local_48;
  
  pNVar1 = (this->colValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->colValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar1) {
    (this->colValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar1;
  }
  lVar4 = (long)colVec->head;
  pdVar5 = (double *)(colVec->nodeIndex + lVar4);
  if (lVar4 == -1) {
    pdVar5 = (double *)0x0;
  }
  pHVar2 = colVec->nodeNext;
  pdVar6 = colVec->nodeValue + lVar4;
  if (lVar4 == -1) {
    pdVar6 = (double *)0x0;
  }
  while ((int)lVar4 != -1) {
    local_48.fixValue = *pdVar6;
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
                *)&this->colValues,
               (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + *(int *)pdVar5,&local_48.fixValue);
    lVar3 = (long)(int)lVar4;
    lVar4 = (long)pHVar2[lVar3];
    pdVar5 = (double *)((long)pdVar5 + lVar4 * 4 + lVar3 * -4);
    pdVar6 = pdVar6 + (lVar4 - lVar3);
  }
  local_48.fixValue = 0.0;
  local_48.col = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[col];
  local_48.fixType = kZero;
  local_48.colCost = colCost;
  HighsDataStack::push<presolve::HighsPostsolveStack::FixedCol,_0>(&this->reductionValues,&local_48)
  ;
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (&this->reductionValues,&this->colValues);
  reductionAdded(this,kFixedCol);
  return;
}

Assistant:

void fixedColAtZero(HighsInt col, double colCost,
                      const HighsMatrixSlice<ColStorageFormat>& colVec) {
    colValues.clear();
    for (const HighsSliceNonzero& colVal : colVec)
      colValues.emplace_back(origRowIndex[colVal.index()], colVal.value());

    reductionValues.push(
        FixedCol{0.0, colCost, origColIndex[col], HighsBasisStatus::kZero});
    reductionValues.push(colValues);
    reductionAdded(ReductionType::kFixedCol);
  }